

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O0

int evthread_posix_cond_wait(void *cond_,void *lock_,timeval *tv)

{
  int iVar1;
  undefined1 local_70 [8];
  timespec ts;
  timeval abstime;
  timeval now;
  pthread_mutex_t *lock;
  pthread_cond_t *cond;
  int r;
  timeval *tv_local;
  void *lock__local;
  void *cond__local;
  
  if (tv == (timeval *)0x0) {
    iVar1 = pthread_cond_wait((pthread_cond_t *)cond_,(pthread_mutex_t *)lock_);
    cond__local._4_4_ = 0;
    if (iVar1 != 0) {
      cond__local._4_4_ = -1;
    }
  }
  else {
    gettimeofday((timeval *)&abstime.tv_usec,(__timezone_ptr_t)0x0);
    ts.tv_nsec = abstime.tv_usec + tv->tv_sec;
    abstime.tv_sec = now.tv_sec + tv->tv_usec;
    if (999999 < abstime.tv_sec) {
      ts.tv_nsec = ts.tv_nsec + 1;
      abstime.tv_sec = abstime.tv_sec + -1000000;
    }
    local_70 = (undefined1  [8])ts.tv_nsec;
    ts.tv_sec = abstime.tv_sec * 1000;
    iVar1 = pthread_cond_timedwait
                      ((pthread_cond_t *)cond_,(pthread_mutex_t *)lock_,(timespec *)local_70);
    if (iVar1 == 0x6e) {
      cond__local._4_4_ = 1;
    }
    else if (iVar1 == 0) {
      cond__local._4_4_ = 0;
    }
    else {
      cond__local._4_4_ = -1;
    }
  }
  return cond__local._4_4_;
}

Assistant:

static int
evthread_posix_cond_wait(void *cond_, void *lock_, const struct timeval *tv)
{
	int r;
	pthread_cond_t *cond = cond_;
	pthread_mutex_t *lock = lock_;

	if (tv) {
		struct timeval now, abstime;
		struct timespec ts;
		evutil_gettimeofday(&now, NULL);
		evutil_timeradd(&now, tv, &abstime);
		ts.tv_sec = abstime.tv_sec;
		ts.tv_nsec = abstime.tv_usec*1000;
		r = pthread_cond_timedwait(cond, lock, &ts);
		if (r == ETIMEDOUT)
			return 1;
		else if (r)
			return -1;
		else
			return 0;
	} else {
		r = pthread_cond_wait(cond, lock);
		return r ? -1 : 0;
	}
}